

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O3

FPinfo * amrex::FabArrayBase::TheFPinfo
                   (FabArrayBase *srcfa,FabArrayBase *dstfa,IntVect *dstng,BoxConverter *coarsener,
                   Geometry *fgeom,Geometry *cgeom,IndexSpace *index_space)

{
  Long *pLVar1;
  int *piVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int i;
  uint uVar10;
  int iVar11;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  _Var12;
  FPinfo *pFVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  IndexType IVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  pVar21;
  Box local_d8;
  BoxConverter *local_b0;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*> local_a8;
  int local_90;
  _Alloc_node __an;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  key_type local_68;
  Box *local_50;
  FabArrayBase *local_48;
  FabArrayBase *local_40;
  Geometry *local_38;
  
  uVar6 = *(undefined8 *)((fgeom->domain).smallend.vect + 2);
  uVar7 = *(undefined8 *)((fgeom->domain).bigend.vect + 2);
  local_d8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fgeom->domain).bigend.vect >> 0x20);
  local_d8.bigend.vect[2] = (int)uVar7;
  local_d8.btype.itype = SUB84(uVar7,4);
  uVar8 = local_d8._20_8_;
  local_d8.smallend.vect._0_8_ = *(undefined8 *)(fgeom->domain).smallend.vect;
  local_d8.smallend.vect[2] = (int)uVar6;
  local_d8.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
  uVar10 = 0;
  switch((dstfa->boxarray).m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar10 = *(uint *)&(dstfa->boxarray).m_bat.m_op;
    break;
  default:
    uVar10 = *(uint *)((long)&(dstfa->boxarray).m_bat.m_op + 4);
  }
  local_50 = &fgeom->domain;
  local_d8.btype.itype = SUB84(uVar7,4);
  lVar15 = 0;
  IVar17.itype = local_d8.btype.itype;
  local_d8._20_8_ = uVar8;
  do {
    uVar16 = 1 << ((byte)lVar15 & 0x1f);
    uVar14 = (uint)lVar15;
    local_d8.bigend.vect[lVar15] =
         (local_d8.bigend.vect[lVar15] + (uint)((uVar10 >> (uVar14 & 0x1f) & 1) != 0)) -
         (uint)((IVar17.itype >> (uVar14 & 0x1f) & 1) != 0);
    if ((uVar10 >> (uVar14 & 0x1f) & 1) == 0) {
      IVar17.itype = ~uVar16 & local_d8.btype.itype;
    }
    else {
      IVar17.itype = uVar16 | local_d8.btype.itype;
    }
    local_d8.btype.itype = IVar17.itype;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  lVar15 = 0;
  do {
    if (*(char *)((long)(fgeom->super_CoordSys).inv_dx + lVar15 + 0x19) == '\x01') {
      iVar11 = dstng->vect[lVar15];
      piVar2 = local_d8.smallend.vect + lVar15;
      *piVar2 = *piVar2 - iVar11;
      piVar2 = local_d8.bigend.vect + lVar15;
      *piVar2 = *piVar2 + iVar11;
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  peVar3 = (srcfa->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar4 = (srcfa->distributionMap).m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.m_ba_id.data =
       (dstfa->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.m_dm_id.data =
       (dstfa->distributionMap).m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0 = coarsener;
  local_48 = srcfa;
  local_40 = dstfa;
  local_38 = cgeom;
  pVar21 = std::
           _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
           ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                          *)m_TheFillPatchCache,&local_68);
  _Var12 = pVar21.first._M_node;
  do {
    if (_Var12._M_node == (_Base_ptr)pVar21.second._M_node) {
      pFVar13 = (FPinfo *)operator_new(0x148);
      FPinfo::FPinfo(pFVar13,local_48,local_40,&local_d8,dstng,local_b0,local_50,&local_38->domain,
                     index_space);
      iVar11 = m_FPinfo_stats + 1;
      if (m_FPinfo_stats < DAT_0071af5c) {
        iVar11 = DAT_0071af5c;
      }
      m_FPinfo_stats = m_FPinfo_stats + 1;
      pFVar13->m_nuse = 1;
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      _DAT_0071af68 = _DAT_0071af68 + 1;
      lRam000000000071af70 = lRam000000000071af70 - auVar20._8_8_;
      local_a8.first.m_ba_id.data = local_68.m_ba_id.data;
      local_a8.first.m_dm_id.data = local_68.m_dm_id.data;
      __an._M_t = (_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                   *)m_TheFillPatchCache;
      DAT_0071af5c = iVar11;
      local_a8.second = pFVar13;
      std::
      _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
      ::
      _M_insert_equal_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>::_Alloc_node>
                ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
                  *)m_TheFillPatchCache,(_Base_ptr)pVar21.second._M_node,&local_a8,&__an);
      if ((peVar3 != local_68.m_ba_id.data) || (peVar4 != local_68.m_dm_id.data)) {
        local_a8.first.m_ba_id.data = peVar3;
        local_a8.first.m_dm_id.data = peVar4;
        local_a8.second = pFVar13;
        std::
        _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
        ::_M_insert_equal<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>
                  ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
                    *)m_TheFillPatchCache,&local_a8);
      }
      return pFVar13;
    }
    p_Var5 = _Var12._M_node[1]._M_left;
    if (((element_type *)p_Var5[7]._M_left == peVar3) &&
       ((element_type *)p_Var5[7]._M_right == peVar4)) {
      local_68.m_ba_id.data._4_4_ = (int)((ulong)local_68.m_ba_id.data >> 0x20);
      local_68.m_dm_id.data._4_4_ = (int)((ulong)local_68.m_dm_id.data >> 0x20);
      auVar18._0_4_ = -(uint)(p_Var5[8]._M_color == (_Rb_tree_color)local_68.m_ba_id.data);
      auVar18._4_4_ = -(uint)(*(int *)&p_Var5[8].field_0x4 == local_68.m_ba_id.data._4_4_);
      auVar18._8_4_ = -(uint)(*(int *)&p_Var5[8]._M_parent == (int)local_68.m_dm_id.data);
      auVar18._12_4_ =
           -(uint)(*(int *)((long)&p_Var5[8]._M_parent + 4) == local_68.m_dm_id.data._4_4_);
      auVar19._4_4_ = auVar18._0_4_;
      auVar19._0_4_ = auVar18._4_4_;
      auVar19._8_4_ = auVar18._12_4_;
      auVar19._12_4_ = auVar18._8_4_;
      iVar11 = movmskpd((int)_Var12._M_node,auVar19 & auVar18);
      if (((iVar11 == 3) &&
          (((bVar9 = Box::operator==((Box *)&p_Var5[8]._M_left,&local_d8), bVar9 &&
            (p_Var5 = _Var12._M_node[1]._M_left,
            *(int *)((long)&p_Var5[9]._M_parent + 4) == dstng->vect[0])) &&
           (*(int *)&p_Var5[9]._M_left == dstng->vect[1])))) &&
         ((*(int *)((long)&p_Var5[9]._M_left + 4) == dstng->vect[2] &&
          (local_d8.btype.itype == *(uint *)&p_Var5[9]._M_parent)))) {
        (*(code *)**(undefined8 **)p_Var5[9]._M_right)
                  (&local_a8,p_Var5[9]._M_right,&p_Var5[8]._M_left);
        (**local_b0->_vptr_BoxConverter)(&__an,local_b0,&local_d8);
        if ((int)local_a8.first.m_ba_id.data == (int)__an._M_t) {
          if (((local_a8.first.m_ba_id.data._4_4_ == __an._M_t._4_4_) &&
              ((int)local_a8.first.m_dm_id.data == local_80)) &&
             ((local_a8.first.m_dm_id.data._4_4_ == local_7c &&
              ((((int)local_a8.second == local_78 && (local_a8.second._4_4_ == local_74)) &&
               (local_90 == local_70)))))) {
            pFVar13 = (FPinfo *)_Var12._M_node[1]._M_left;
            pLVar1 = &pFVar13->m_nuse;
            *pLVar1 = *pLVar1 + 1;
            _DAT_0071af68 = _DAT_0071af68 + 1;
            return pFVar13;
          }
        }
      }
    }
    _Var12._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var12._M_node);
  } while( true );
}

Assistant:

const FabArrayBase::FPinfo&
FabArrayBase::TheFPinfo (const FabArrayBase& srcfa,
                         const FabArrayBase& dstfa,
                         const IntVect&      dstng,
                         const BoxConverter& coarsener,
                         const Geometry&     fgeom,
                         const Geometry&     cgeom,
                         const EB2::IndexSpace* index_space)
{
    BL_PROFILE("FabArrayBase::TheFPinfo()");

    Box dstdomain = fgeom.Domain();
    dstdomain.convert(dstfa.boxArray().ixType());
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (fgeom.isPeriodic(i)) {
            dstdomain.grow(i,dstng[i]);
        }
    }

    const BDKey& srckey = srcfa.getBDKey();
    const BDKey& dstkey = dstfa.getBDKey();

    std::pair<FPinfoCacheIter,FPinfoCacheIter> er_it = m_TheFillPatchCache.equal_range(dstkey);

    for (FPinfoCacheIter it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_srcbdk    == srckey    &&
            it->second->m_dstbdk    == dstkey    &&
            it->second->m_dstdomain == dstdomain &&
            it->second->m_dstng     == dstng     &&
            it->second->m_dstdomain.ixType() == dstdomain.ixType() &&
            it->second->m_coarsener->doit(it->second->m_dstdomain) == coarsener.doit(dstdomain))
        {
            ++(it->second->m_nuse);
            m_FPinfo_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    FPinfo* new_fpc = new FPinfo(srcfa, dstfa, dstdomain, dstng, coarsener,
                                 fgeom.Domain(), cgeom.Domain(), index_space);

#ifdef AMREX_MEM_PROFILING
    m_FPinfo_stats.bytes += new_fpc->bytes();
    m_FPinfo_stats.bytes_hwm = std::max(m_FPinfo_stats.bytes_hwm, m_FPinfo_stats.bytes);
#endif

    new_fpc->m_nuse = 1;
    m_FPinfo_stats.recordBuild();
    m_FPinfo_stats.recordUse();

    m_TheFillPatchCache.insert(er_it.second, FPinfoCache::value_type(dstkey,new_fpc));
    if (srckey != dstkey)
        m_TheFillPatchCache.insert(          FPinfoCache::value_type(srckey,new_fpc));

    return *new_fpc;
}